

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O1

CurveNetworkNodeVectorQuantity * __thiscall
polyscope::CurveNetwork::addNodeVectorQuantityImpl
          (CurveNetwork *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vectors,VectorType vectorType)

{
  pointer pcVar1;
  CurveNetworkNodeVectorQuantity *this_00;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_88;
  string local_70;
  string local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  QuantityStructure<polyscope::CurveNetwork>::checkForQuantityWithNameAndDeleteOrError
            (&this->super_QuantityStructure<polyscope::CurveNetwork>,&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this_00 = (CurveNetworkNodeVectorQuantity *)operator_new(0x3a8);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(&local_88,vectors);
  CurveNetworkNodeVectorQuantity::CurveNetworkNodeVectorQuantity
            (this_00,&local_70,&local_88,this,vectorType);
  if (local_88.
      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  QuantityStructure<polyscope::CurveNetwork>::addQuantity
            (&this->super_QuantityStructure<polyscope::CurveNetwork>,(QuantityType *)this_00,true);
  return this_00;
}

Assistant:

CurveNetworkNodeVectorQuantity* CurveNetwork::addNodeVectorQuantityImpl(std::string name,
                                                                        const std::vector<glm::vec3>& vectors,
                                                                        VectorType vectorType) {
  checkForQuantityWithNameAndDeleteOrError(name);
  CurveNetworkNodeVectorQuantity* q = new CurveNetworkNodeVectorQuantity(name, vectors, *this, vectorType);
  addQuantity(q);
  return q;
}